

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O3

void Io_Write(Abc_Ntk_t *pNtk,char *pFileName,Io_FileType_t FileType)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  size_t __size;
  char *__ptr;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    __ptr = "Empty network.\n";
    __size = 0xf;
    goto LAB_00337cd7;
  }
  if ((FileType == IO_FILE_UNKNOWN) || (FileType == IO_FILE_NONE)) {
    __ptr = "The generic file writer requires a known file extension.\n";
  }
  else {
    if (FileType - IO_FILE_AIGER < 2) {
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        if (FileType != IO_FILE_AIGER) {
          Io_WriteBaf(pNtk,pFileName);
          return;
        }
        Io_WriteAiger(pNtk,pFileName,1,0,0);
        return;
      }
      __ptr = "Writing this format is only possible for structurally hashed AIGs.\n";
      __size = 0x43;
      goto LAB_00337cd7;
    }
    switch(FileType) {
    case IO_FILE_BBLIF:
      if (pNtk->ntkType == ABC_NTK_LOGIC) {
        if (pNtk->ntkFunc != ABC_FUNC_SOP) {
          Abc_NtkToSop(pNtk,-1,1000000000);
        }
        Io_WriteBblif(pNtk,pFileName);
        return;
      }
      __ptr = "Writing Binary BLIF is only possible for logic networks.\n";
      break;
    default:
      if (FileType == IO_FILE_PLA) {
        iVar1 = Abc_NtkLevel(pNtk);
        if (1 < iVar1) {
          __ptr = "PLA writing is available for collapsed networks.\n";
          __size = 0x31;
          goto LAB_00337cd7;
        }
        if (pNtk->nObjCounts[8] == 0) {
          pNtk_01 = Abc_NtkToNetlist(pNtk);
        }
        else {
          fwrite("Latches are writen into the PLA file at PI/PO pairs.\n",0x35,1,_stdout);
          pNtk_00 = Abc_NtkDup(pNtk);
          Abc_NtkMakeComb(pNtk_00,0);
          pNtk_01 = Abc_NtkToNetlist(pNtk);
          Abc_NtkDelete(pNtk_00);
        }
        iVar1 = Abc_NtkToSop(pNtk_01,1,1000000000);
        if (iVar1 == 0) {
          return;
        }
      }
      else {
        if (FileType == IO_FILE_BENCH) {
          if (pNtk->ntkType != ABC_NTK_STRASH) {
            __ptr = "Writing traditional BENCH is available for AIGs only (use \"write_bench\").\n";
            __size = 0x4a;
            goto LAB_00337cd7;
          }
        }
        else {
          if (FileType != IO_FILE_SMV) {
            if (FileType == IO_FILE_MOPLA) {
              pNtk_01 = Abc_NtkStrash(pNtk,0,0,0);
            }
            else {
              pNtk_01 = Abc_NtkToNetlist(pNtk);
            }
            goto LAB_00337f21;
          }
          if (pNtk->ntkType != ABC_NTK_STRASH) {
            __ptr = "Writing traditional SMV is available for AIGs only.\n";
            __size = 0x34;
            goto LAB_00337cd7;
          }
        }
        pNtk_01 = Abc_NtkToNetlistBench(pNtk);
      }
LAB_00337f21:
      if (pNtk_01 != (Abc_Ntk_t *)0x0) {
        switch(FileType) {
        case IO_FILE_BLIF:
          if ((pNtk_01->ntkFunc != ABC_FUNC_SOP) && (pNtk_01->ntkFunc != ABC_FUNC_MAP)) {
            Abc_NtkToSop(pNtk_01,-1,1000000000);
          }
          Io_WriteBlif(pNtk_01,pFileName,1,0,0);
          break;
        case IO_FILE_BLIFMV:
          iVar1 = Abc_NtkConvertToBlifMv(pNtk_01);
          if (iVar1 == 0) {
            return;
          }
          Io_WriteBlifMv(pNtk_01,pFileName);
          break;
        case IO_FILE_BENCH:
          Io_WriteBench(pNtk_01,pFileName);
          break;
        case IO_FILE_BOOK:
          Io_WriteBook(pNtk_01,pFileName);
          break;
        default:
          if (FileType == IO_FILE_PLA) {
            Io_WritePla(pNtk_01,pFileName);
          }
          else {
            switch(FileType) {
            case IO_FILE_EQN:
              if (pNtk_01->ntkFunc != ABC_FUNC_AIG) {
                Abc_NtkToAig(pNtk_01);
              }
              Io_WriteEqn(pNtk_01,pFileName);
              break;
            default:
              Io_Write_cold_1();
              break;
            case IO_FILE_MOPLA:
              Io_WriteMoPla(pNtk_01,pFileName);
              break;
            case IO_FILE_SMV:
              Io_WriteSmv(pNtk_01,pFileName);
              break;
            case IO_FILE_VERILOG:
              if (1 < pNtk_01->ntkFunc - ABC_FUNC_AIG) {
                Abc_NtkToAig(pNtk_01);
              }
              Io_WriteVerilog(pNtk_01,pFileName,0);
            }
          }
        }
        Abc_NtkDelete(pNtk_01);
        return;
      }
      __ptr = "Converting to netlist has failed.\n";
      __size = 0x22;
      goto LAB_00337cd7;
    case IO_FILE_CNF:
      Io_WriteCnf(pNtk,pFileName,0);
      return;
    case IO_FILE_DOT:
      Io_WriteDot(pNtk,pFileName);
      return;
    case IO_FILE_GML:
      Io_WriteGml(pNtk,pFileName);
      return;
    }
  }
  __size = 0x39;
LAB_00337cd7:
  fwrite(__ptr,__size,1,_stdout);
  return;
}

Assistant:

void Io_Write( Abc_Ntk_t * pNtk, char * pFileName, Io_FileType_t FileType )
{
    Abc_Ntk_t * pNtkTemp, * pNtkCopy;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }
    // check if the file extension if given
    if ( FileType == IO_FILE_NONE || FileType == IO_FILE_UNKNOWN )
    {
        fprintf( stdout, "The generic file writer requires a known file extension.\n" );
        return;
    }
    // write the AIG formats
    if ( FileType == IO_FILE_AIGER || FileType == IO_FILE_BAF )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing this format is only possible for structurally hashed AIGs.\n" );
            return;
        }
        if ( FileType == IO_FILE_AIGER )
            Io_WriteAiger( pNtk, pFileName, 1, 0, 0 );
        else //if ( FileType == IO_FILE_BAF )
            Io_WriteBaf( pNtk, pFileName );
        return;
    }
    // write non-netlist types
    if ( FileType == IO_FILE_CNF )
    {
        Io_WriteCnf( pNtk, pFileName, 0 );
        return;
    }
    if ( FileType == IO_FILE_DOT )
    {
        Io_WriteDot( pNtk, pFileName );
        return;
    }
    if ( FileType == IO_FILE_GML )
    {
        Io_WriteGml( pNtk, pFileName );
        return;
    }
    if ( FileType == IO_FILE_BBLIF )
    {
        if ( !Abc_NtkIsLogic(pNtk) )
        {
            fprintf( stdout, "Writing Binary BLIF is only possible for logic networks.\n" );
            return;
        }
        if ( !Abc_NtkHasSop(pNtk) )
            Abc_NtkToSop( pNtk, -1, ABC_INFINITY );
        Io_WriteBblif( pNtk, pFileName );
        return;
    }
/*
    if ( FileType == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtk, pFileName );
        return;
    }
*/
    // convert logic network into netlist
    if ( FileType == IO_FILE_PLA )
    {
        if ( Abc_NtkLevel(pNtk) > 1 )
        {
            fprintf( stdout, "PLA writing is available for collapsed networks.\n" );
            return;
        }
        if ( Abc_NtkIsComb(pNtk) )
            pNtkTemp = Abc_NtkToNetlist( pNtk );
        else
        {
            fprintf( stdout, "Latches are writen into the PLA file at PI/PO pairs.\n" );
            pNtkCopy = Abc_NtkDup( pNtk );
            Abc_NtkMakeComb( pNtkCopy, 0 );
            pNtkTemp = Abc_NtkToNetlist( pNtk );
            Abc_NtkDelete( pNtkCopy );
        }
        if ( !Abc_NtkToSop( pNtkTemp, 1, ABC_INFINITY ) )
            return;
    }
    else if ( FileType == IO_FILE_MOPLA )
    {
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
    }
    else if ( FileType == IO_FILE_BENCH )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing traditional BENCH is available for AIGs only (use \"write_bench\").\n" );
            return;
        }
        pNtkTemp = Abc_NtkToNetlistBench( pNtk );
    }
    else if ( FileType == IO_FILE_SMV )
    {
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            fprintf( stdout, "Writing traditional SMV is available for AIGs only.\n" );
            return;
        }
        pNtkTemp = Abc_NtkToNetlistBench( pNtk );
    }
    else
        pNtkTemp = Abc_NtkToNetlist( pNtk );

    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Converting to netlist has failed.\n" );
        return;
    }

    if ( FileType == IO_FILE_BLIF )
    {
        if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
            Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        Io_WriteBlif( pNtkTemp, pFileName, 1, 0, 0 );
    }
    else if ( FileType == IO_FILE_BLIFMV )
    {
        if ( !Abc_NtkConvertToBlifMv( pNtkTemp ) )
            return;
        Io_WriteBlifMv( pNtkTemp, pFileName );
    }
    else if ( FileType == IO_FILE_BENCH )
        Io_WriteBench( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_BOOK )
        Io_WriteBook( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_PLA )
        Io_WritePla( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_MOPLA )
        Io_WriteMoPla( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_EQN )
    {
        if ( !Abc_NtkHasAig(pNtkTemp) )
            Abc_NtkToAig( pNtkTemp );
        Io_WriteEqn( pNtkTemp, pFileName );
    }
    else if ( FileType == IO_FILE_SMV )
        Io_WriteSmv( pNtkTemp, pFileName );
    else if ( FileType == IO_FILE_VERILOG )
    {
        if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
            Abc_NtkToAig( pNtkTemp );
        Io_WriteVerilog( pNtkTemp, pFileName, 0 );
    }
    else 
        fprintf( stderr, "Unknown file format.\n" );
    Abc_NtkDelete( pNtkTemp );
}